

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O2

SharedPtr<vkt::Draw::Image> __thiscall
vkt::Draw::Image::create
          (Image *this,DeviceInterface *vk,VkDevice device,VkImageCreateInfo *createInfo)

{
  VkFormat VVar1;
  deUint32 dVar2;
  Image *ptr;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Image> SVar3;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ptr = (Image *)operator_new(0x70);
  VVar1 = createInfo->format;
  local_48._0_4_ = createInfo->mipLevels;
  local_48._4_4_ = createInfo->arrayLayers;
  uStack_40 = 0;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_68,vk,device,createInfo,
                    (VkAllocationCallbacks *)0x0);
  (ptr->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_68.m_data.deleter.m_device;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_68.m_data.deleter.m_allocator;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_68.m_data.object.m_internal;
  (ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_68.m_data.deleter.m_deviceIface;
  local_68.m_data.object.m_internal = 0;
  local_68.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_68.m_data.deleter.m_device = (VkDevice)0x0;
  local_68.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ptr->m_format = VVar1;
  dVar2 = (createInfo->extent).height;
  (ptr->m_extent).width = (createInfo->extent).width;
  (ptr->m_extent).height = dVar2;
  (ptr->m_extent).depth = (createInfo->extent).depth;
  ptr->m_levelCount = (undefined4)local_48;
  ptr->m_layerCount = local_48._4_4_;
  (ptr->m_pixelAccessData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ptr->m_pixelAccessData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (ptr->m_pixelAccessData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  ptr->m_vk = vk;
  ptr->m_device = device;
  de::SharedPtr<vkt::Draw::Image>::SharedPtr((SharedPtr<vkt::Draw::Image> *)this,ptr);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_68);
  SVar3.m_state = extraout_RDX;
  SVar3.m_ptr = this;
  return SVar3;
}

Assistant:

de::SharedPtr<Image> Image::create(const vk::DeviceInterface&	vk,
								   vk::VkDevice					device,
								   const vk::VkImageCreateInfo	&createInfo)
{
	return de::SharedPtr<Image>(new Image(vk, device, createInfo.format, createInfo.extent,
								createInfo.mipLevels, createInfo.arrayLayers,
								vk::createImage(vk, device, &createInfo)));
}